

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_or(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  TCGv_i64 pTVar2;
  uint uVar3;
  uintptr_t o;
  TCGTemp *ts;
  TCGv_i32 pTVar4;
  uintptr_t o_2;
  uintptr_t o_1;
  TCGv_i64 pTVar5;
  uint uVar6;
  uint uVar7;
  int64_t arg2;
  TCGContext_conflict10 *tcg_ctx;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode;
  uVar3 = uVar1 >> 0x15 & 0x1f;
  uVar7 = uVar1 >> 0x10 & 0x1f;
  uVar6 = uVar1 >> 0xb & 0x1f;
  if (uVar3 != uVar6 || uVar3 != uVar7) {
    pTVar5 = cpu_gpr[uVar7];
    pTVar2 = cpu_gpr[uVar3];
    if (uVar3 == uVar6) {
      if (pTVar5 != pTVar2) {
        tcg_gen_op2_ppc64(tcg_ctx,INDEX_op_mov_i64,(TCGArg)((long)&tcg_ctx->pool_cur + (long)pTVar5)
                          ,(TCGArg)((long)&tcg_ctx->pool_cur + (long)pTVar2));
      }
    }
    else {
      tcg_gen_op3_ppc64(tcg_ctx,INDEX_op_or_i64,(TCGArg)((long)&tcg_ctx->pool_cur + (long)pTVar5),
                        (TCGArg)((long)&tcg_ctx->pool_cur + (long)pTVar2),
                        (TCGArg)((long)&tcg_ctx->pool_cur + (long)cpu_gpr[uVar6]));
    }
    if ((ctx->opcode & 1) != 0) {
      gen_or_cold_1();
    }
    return;
  }
  if ((uVar1 & 1) != 0) {
    uVar1._0_1_ = ctx->sf_mode;
    uVar1._1_1_ = ctx->has_cfar;
    uVar1._2_1_ = ctx->fpu_enabled;
    uVar1._3_1_ = ctx->altivec_enabled;
    gen_set_Rc0((DisasContext_conflict10 *)(ulong)uVar1,(TCGv_i64)tcg_ctx);
    return;
  }
  if (uVar3 == 0) {
    return;
  }
  switch(uVar3) {
  case 1:
    arg2 = 0x8000000000000;
    break;
  case 2:
    arg2 = 0x10000000000000;
    break;
  case 3:
    if (ctx->pr != false) goto switchD_00b80316_caseD_4;
    arg2 = 0x18000000000000;
    break;
  case 4:
    goto switchD_00b80316_caseD_4;
  case 5:
    if (ctx->pr != false) goto switchD_00b80316_caseD_4;
    arg2 = 0x14000000000000;
    break;
  case 6:
    arg2 = 0xc000000000000;
    break;
  case 7:
    if ((ctx->hv != true) || (ctx->pr != false)) goto switchD_00b80316_caseD_4;
    arg2 = 0x1c000000000000;
    break;
  default:
    if ((uVar3 != 0x1f) || (ctx->pr != false)) goto switchD_00b80316_caseD_4;
    arg2 = 0x4000000000000;
  }
  ts = tcg_temp_new_internal_ppc64(tcg_ctx,TCG_TYPE_I64,false);
  pTVar5 = (TCGv_i64)((long)ts - (long)tcg_ctx);
  tcg_gen_op3_ppc64(tcg_ctx,INDEX_op_ld_i64,(TCGArg)ts,(TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),
                    0x2718);
  tcg_gen_andi_i64_ppc64(tcg_ctx,pTVar5,pTVar5,-0x1c000000000001);
  tcg_gen_ori_i64_ppc64(tcg_ctx,pTVar5,pTVar5,arg2);
  tcg_gen_op3_ppc64(tcg_ctx,INDEX_op_st_i64,(TCGArg)ts,(TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),
                    0x2718);
  tcg_temp_free_internal_ppc64(tcg_ctx,ts);
  tcg_ctx = ctx->uc->tcg_ctx;
switchD_00b80316_caseD_4:
  pTVar4 = tcg_const_i32_ppc64(tcg_ctx,0);
  tcg_gen_op3_ppc64(tcg_ctx,INDEX_op_st_i32,(TCGArg)(pTVar4 + (long)tcg_ctx),
                    (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),0xffffffffffffe3d8);
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
  gen_exception_nip(ctx,0x10001,(ctx->base).pc_next);
  return;
}

Assistant:

static void gen_or(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int rs, ra, rb;

    rs = rS(ctx->opcode);
    ra = rA(ctx->opcode);
    rb = rB(ctx->opcode);
    /* Optimisation for mr. ri case */
    if (rs != ra || rs != rb) {
        if (rs != rb) {
            tcg_gen_or_tl(tcg_ctx, cpu_gpr[ra], cpu_gpr[rs], cpu_gpr[rb]);
        } else {
            tcg_gen_mov_tl(tcg_ctx, cpu_gpr[ra], cpu_gpr[rs]);
        }
        if (unlikely(Rc(ctx->opcode) != 0)) {
            gen_set_Rc0(ctx, cpu_gpr[ra]);
        }
    } else if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, cpu_gpr[rs]);
#if defined(TARGET_PPC64)
    } else if (rs != 0) { /* 0 is nop */
        int prio = 0;

        switch (rs) {
        case 1:
            /* Set process priority to low */
            prio = 2;
            break;
        case 6:
            /* Set process priority to medium-low */
            prio = 3;
            break;
        case 2:
            /* Set process priority to normal */
            prio = 4;
            break;
        case 31:
            if (!ctx->pr) {
                /* Set process priority to very low */
                prio = 1;
            }
            break;
        case 5:
            if (!ctx->pr) {
                /* Set process priority to medium-hight */
                prio = 5;
            }
            break;
        case 3:
            if (!ctx->pr) {
                /* Set process priority to high */
                prio = 6;
            }
            break;
        case 7:
            if (ctx->hv && !ctx->pr) {
                /* Set process priority to very high */
                prio = 7;
            }
            break;
        default:
            break;
        }
        if (prio) {
            TCGv t0 = tcg_temp_new(tcg_ctx);
            gen_load_spr(tcg_ctx, t0, SPR_PPR);
            tcg_gen_andi_tl(tcg_ctx, t0, t0, ~0x001C000000000000ULL);
            tcg_gen_ori_tl(tcg_ctx, t0, t0, ((uint64_t)prio) << 50);
            gen_store_spr(tcg_ctx, SPR_PPR, t0);
            tcg_temp_free(tcg_ctx, t0);
        }
        /*
         * Pause out of TCG otherwise spin loops with smt_low eat too
         * much CPU and the kernel hangs.  This applies to all
         * encodings other than no-op, e.g., miso(rs=26), yield(27),
         * mdoio(29), mdoom(30), and all currently undefined.
         */
        gen_pause(ctx);
#endif
    }
}